

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csp_if_can_pbuf.c
# Opt level: O0

csp_packet_t * csp_can_pbuf_new(csp_can_interface_data_t *ifdata,uint32_t id,int *task_woken)

{
  int *in_RDX;
  uint32_t in_ESI;
  long in_RDI;
  csp_packet_t *packet;
  uint32_t now;
  csp_packet_t *local_38;
  uint32_t local_2c;
  undefined4 in_stack_fffffffffffffff0;
  
  csp_can_pbuf_cleanup
            ((csp_can_interface_data_t *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),in_RDX);
  if (in_RDX == (int *)0x0) {
    local_2c = csp_get_ms();
  }
  else {
    local_2c = csp_get_ms_isr();
  }
  if (in_RDX == (int *)0x0) {
    local_38 = csp_buffer_get_always();
  }
  else {
    local_38 = csp_buffer_get_always_isr();
  }
  (local_38->field_0).field_1.last_used = local_2c;
  (local_38->field_0).field_0.timestamp_rx = in_ESI;
  (local_38->field_0).field_1.remain = 0;
  local_38->next = *(csp_packet_s **)(in_RDI + 0x10);
  *(csp_packet_t **)(in_RDI + 0x10) = local_38;
  return local_38;
}

Assistant:

csp_packet_t * csp_can_pbuf_new(csp_can_interface_data_t * ifdata, uint32_t id, int * task_woken) {

	csp_can_pbuf_cleanup(ifdata, task_woken);

	uint32_t now = (task_woken) ? csp_get_ms_isr() : csp_get_ms();

	csp_packet_t * packet = (task_woken) ? csp_buffer_get_always_isr() : csp_buffer_get_always();

	packet->last_used = now;
	packet->cfpid = id;
	packet->remain = 0;

	/* Insert at beginning, because easy */
	packet->next = ifdata->pbufs;
	ifdata->pbufs = packet;

	return packet;
}